

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_array2d.h
# Opt level: O2

Array2D<interval> * __thiscall
TNT::Array2D<interval>::ref(Array2D<interval> *this,Array2D<interval> *A)

{
  int iVar1;
  
  if (this != A) {
    Array1D<interval_*>::ref(&this->v_,&A->v_);
    Array1D<interval>::ref(&this->data_,&A->data_);
    iVar1 = A->n_;
    this->m_ = A->m_;
    this->n_ = iVar1;
  }
  return this;
}

Assistant:

Array2D<T> & Array2D<T>::ref(const Array2D<T> &A)
{
	if (this != &A)
	{
		v_ = A.v_;
		data_ = A.data_;
		m_ = A.m_;
		n_ = A.n_;
		
	}
	return *this;
}